

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O0

void printWrap(ostream *os,int leftPad,string *content)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  int local_80;
  int i;
  allocator<char> local_69;
  string local_68 [8];
  string pad;
  string nextWord;
  int space;
  int len;
  string *content_local;
  int leftPad_local;
  ostream *os_local;
  
  iVar1 = std::__cxx11::string::size();
  nextWord.field_2._8_4_ = 0x50 - leftPad;
  std::__cxx11::string::string((string *)(pad.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,(long)leftPad,' ',&local_69);
  std::allocator<char>::~allocator(&local_69);
  for (local_80 = 0; local_80 <= iVar1; local_80 = local_80 + 1) {
    if (((local_80 == iVar1) ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content), *pcVar3 == ' ')) ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content), *pcVar3 == '\n')) {
      iVar2 = std::__cxx11::string::size();
      if ((int)nextWord.field_2._8_4_ < iVar2) {
        poVar4 = std::operator<<(os,'\n');
        std::operator<<(poVar4,local_68);
        nextWord.field_2._8_4_ = 0x50 - leftPad;
      }
      std::operator<<(os,(string *)(pad.field_2._M_local_buf + 8));
      iVar2 = std::__cxx11::string::size();
      nextWord.field_2._8_4_ = nextWord.field_2._8_4_ - (iVar2 + 1);
      if (0 < (int)nextWord.field_2._8_4_) {
        std::operator<<(os,' ');
      }
      std::__cxx11::string::clear();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content);
      if (*pcVar3 == '\n') {
        std::operator<<(os,'\n');
        nextWord.field_2._8_4_ = 0x50 - leftPad;
      }
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)content);
      std::__cxx11::string::operator+=((string *)(pad.field_2._M_local_buf + 8),*pcVar3);
    }
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(pad.field_2._M_local_buf + 8));
  return;
}

Assistant:

void printWrap(std::ostream& os, int leftPad, const std::string& content) {
  int len = content.size();
  int space = SCREEN_WIDTH - leftPad;
  std::string nextWord;
  std::string pad(leftPad, ' ');
  for (int i = 0; i <= len; ++i) {
    if (i != len && content[i] != ' ' && content[i] != '\n') {
      nextWord += content[i];
    } else {
      if (static_cast<int>(nextWord.size()) > space) {
        os << '\n' << pad;
        space = SCREEN_WIDTH - leftPad;
      }
      os << nextWord;
      space -= nextWord.size() + 1;
      if (space > 0) {
        os << ' ';
      }
      nextWord.clear();
      if (content[i] == '\n') {
        os << '\n';
        space = SCREEN_WIDTH - leftPad;
      }
    }
  }
}